

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

Message * __thiscall
google::protobuf::Reflection::GetMessage
          (Reflection *this,Message *message,FieldDescriptor *field,MessageFactory *factory)

{
  byte bVar1;
  int number;
  bool bVar2;
  uint32_t uVar3;
  Descriptor *pDVar4;
  MessageLite *pMVar5;
  Message **ppMVar6;
  Message *pMVar7;
  char *description;
  OneofDescriptor *oneof_descriptor;
  Metadata MVar8;
  
  MVar8 = Message::GetMetadata(message);
  if (MVar8.reflection != this) {
LAB_0025a888:
    pDVar4 = this->descriptor_;
    MVar8 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar4,MVar8.descriptor,field,"GetMessage");
  }
  pDVar4 = this->descriptor_;
  if (field->containing_type_ != pDVar4) {
    description = "Field does not match message type.";
LAB_0025a8c6:
    anon_unknown_6::ReportReflectionUsageError(pDVar4,field,"GetMessage",description);
  }
  bVar1 = field->field_0x1;
  if (0xbf < bVar1 != (bool)((bVar1 & 0x20) >> 5)) {
    GetMessage();
    goto LAB_0025a888;
  }
  if ((bVar1 & 0x20) != 0) {
    description = "Field is repeated; the method requires a singular field.";
    goto LAB_0025a8c6;
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 10) {
    anon_unknown_6::ReportReflectionUsageTypeError(pDVar4,field,"GetMessage",CPPTYPE_MESSAGE);
  }
  if ((bVar1 & 8) != 0) {
    if (factory == (MessageFactory *)0x0) {
      factory = this->message_factory_;
    }
    uVar3 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    number = field->number_;
    pDVar4 = FieldDescriptor::message_type(field);
    pMVar5 = internal::ExtensionSet::GetMessage
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3),
                        number,pDVar4,factory);
    return (Message *)pMVar5;
  }
  bVar2 = internal::ReflectionSchema::InRealOneof(&this->schema_,field);
  if (bVar2) {
    if ((field->field_0x1 & 0x10) == 0) {
      oneof_descriptor = (OneofDescriptor *)0x0;
    }
    else {
      oneof_descriptor = (field->scope_).containing_oneof;
      if (oneof_descriptor == (OneofDescriptor *)0x0) {
        internal::protobuf_assumption_failed
                  ("res != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb31);
      }
    }
    uVar3 = GetOneofCase(this,message,oneof_descriptor);
    if (uVar3 != field->number_) goto LAB_0025a85e;
  }
  ppMVar6 = GetRaw<google::protobuf::Message_const*>(this,message,field);
  if (*ppMVar6 != (Message *)0x0) {
    return *ppMVar6;
  }
LAB_0025a85e:
  pMVar7 = GetDefaultMessageInstance(this,field);
  return pMVar7;
}

Assistant:

const Message& Reflection::GetMessage(const Message& message,
                                      const FieldDescriptor* field,
                                      MessageFactory* factory) const {
  USAGE_CHECK_ALL(GetMessage, SINGULAR, MESSAGE);

  if (factory == nullptr) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<const Message&>(GetExtensionSet(message).GetMessage(
        field->number(), field->message_type(), factory));
  } else {
    if (schema_.InRealOneof(field) && !HasOneofField(message, field)) {
      return *GetDefaultMessageInstance(field);
    }
    const Message* result = GetRaw<const Message*>(message, field);
    if (result == nullptr) {
      result = GetDefaultMessageInstance(field);
    }
    return *result;
  }
}